

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_terminal.cpp
# Opt level: O0

void __thiscall
ImportInt64_NegativeOne_Test::ImportInt64_NegativeOne_Test(ImportInt64_NegativeOne_Test *this)

{
  ImportInt64_NegativeOne_Test *this_local;
  
  anon_unknown.dwarf_394386::ImportInt64::ImportInt64(&this->super_ImportInt64);
  (this->super_ImportInt64).super_RuleTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ImportInt64_NegativeOne_Test_003f5898;
  return;
}

Assistant:

TEST_F (ImportInt64, NegativeOne) {
    auto v = std::int64_t{0};
    auto parser = make_json_int64_parser (&v);
    parser.input ("-1");
    parser.eof ();

    // Check the result.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_EQ (v, std::int64_t{-1});
}